

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O0

void print_payload(uint8_t *data,uint_fast8_t length)

{
  uint_fast8_t length_local;
  uint8_t *data_local;
  
  if (length == '\0') {
    fprintf(_stdout,"no payload\n");
  }
  else {
    fwrite(data,(ulong)length,1,_stdout);
    fflush(_stdout);
    fprintf(_stdout,"\n");
  }
  return;
}

Assistant:

static void print_payload(const uint8_t *data, uint_fast8_t length)
{
	if (length > 0) {
		(void)fwrite(data, length, 1, stdout);
		(void)fflush(stdout);
		(void)fprintf(stdout, "\n");
	} else {
		(void)fprintf(stdout, "no payload\n");
	}
}